

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestCannotConstructWithNegativeHandlingDuration_Test
::TestBody(AckMessageTest_TestCannotConstructWithNegativeHandlingDuration_Test *this)

{
  bool bVar1;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AckMessage local_38 [48];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::pixie::AckMessage::AckMessage(local_38,0,0,0,0,-0x4d2);
  }
  testing::Message::Message((Message *)&local_40);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
             ,0x22,
             "Expected: AckMessage(0, 0, 0, 0, -1234) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  return;
}

Assistant:

TEST(AckMessageTest, TestCannotConstructWithNegativeHandlingDuration)
{
    ASSERT_THROW(AckMessage(0, 0, 0, 0, -1234), std::invalid_argument);
}